

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precomputed_scalar_reference_finite_element.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::
PrecompGradientsReferenceShapeFunctions(PrecomputedScalarReferenceFiniteElement<double> *this)

{
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  PrecomputedScalarReferenceFiniteElement<double> *local_10;
  PrecomputedScalarReferenceFiniteElement<double> *this_local;
  
  if (this->fe_ == (ScalarReferenceFiniteElement<double> *)0x0) {
    local_10 = this;
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"Not initialized.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"fe_ != nullptr",&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
               ,&local_1f1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1c8,&local_1f0,0xa7,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"false",&local_239);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
               ,&local_261);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
    lf::base::AssertionFailed(&local_238,&local_260,0xa7,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    abort();
  }
  return &this->grad_shape_fun_;
}

Assistant:

[[nodiscard]] const Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>&
  PrecompGradientsReferenceShapeFunctions() const {
    LF_ASSERT_MSG(fe_ != nullptr, "Not initialized.");
    return grad_shape_fun_;
  }